

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::detail::MultipartFormDataParser::buf_append
          (MultipartFormDataParser *this,char *data,size_t n)

{
  undefined1 uVar1;
  char cVar2;
  size_t sVar3;
  undefined1 *puVar4;
  ulong uVar5;
  char *pcVar6;
  ulong local_38;
  size_t i_1;
  size_t i;
  size_t remaining_size;
  size_t n_local;
  char *data_local;
  MultipartFormDataParser *this_local;
  
  sVar3 = buf_size(this);
  if ((sVar3 != 0) && (this->buf_spos_ != 0)) {
    for (i_1 = 0; i_1 < sVar3; i_1 = i_1 + 1) {
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&this->buf_);
      uVar1 = *puVar4;
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&this->buf_);
      *puVar4 = uVar1;
    }
  }
  this->buf_spos_ = 0;
  this->buf_epos_ = sVar3;
  uVar5 = std::__cxx11::string::size();
  if (uVar5 < sVar3 + n) {
    std::__cxx11::string::resize((ulong)&this->buf_);
  }
  for (local_38 = 0; local_38 < n; local_38 = local_38 + 1) {
    cVar2 = data[local_38];
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->buf_);
    *pcVar6 = cVar2;
  }
  this->buf_epos_ = n + this->buf_epos_;
  return;
}

Assistant:

void buf_append(const char *data, size_t n) {
    auto remaining_size = buf_size();
    if (remaining_size > 0 && buf_spos_ > 0) {
      for (size_t i = 0; i < remaining_size; i++) {
        buf_[i] = buf_[buf_spos_ + i];
      }
    }
    buf_spos_ = 0;
    buf_epos_ = remaining_size;

    if (remaining_size + n > buf_.size()) { buf_.resize(remaining_size + n); }

    for (size_t i = 0; i < n; i++) {
      buf_[buf_epos_ + i] = data[i];
    }
    buf_epos_ += n;
  }